

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ws_audio.c
# Opt level: O2

void ws_audio_update(void *info,UINT32 length,DEV_SMPL **buffer)

{
  short sVar1;
  DEV_SMPL *pDVar2;
  DEV_SMPL *pDVar3;
  UINT32 UVar4;
  int iVar5;
  ushort uVar6;
  uint uVar7;
  ulong uVar8;
  int iVar9;
  uint uVar10;
  byte bVar11;
  byte bVar12;
  char cVar13;
  uint uVar14;
  int iVar15;
  ulong uVar16;
  uint uVar17;
  long lVar18;
  ushort *puVar19;
  byte *pbVar20;
  int iVar21;
  ulong uVar22;
  
  pDVar2 = *buffer;
  pDVar3 = buffer[1];
  uVar8 = 0;
  do {
    if (uVar8 == length) {
      return;
    }
    uVar16 = *(long *)((long)info + 0x50) + *(long *)((long)info + 0x48);
    uVar22 = uVar16 >> 0x20;
    while (iVar9 = (int)uVar22, uVar22 = (ulong)(iVar9 - 1), iVar9 != 0) {
      if ((*(char *)((long)info + 0x5a) != '\0') && ((*(byte *)((long)info + 0xfc) & 0x40) != 0)) {
        sVar1 = *(short *)((long)info + 0x5c);
        if (sVar1 < 0) {
          sVar1 = *(short *)((long)info + 0x58);
          uVar17 = (ushort)((short)*(char *)((long)info + 0x5a) + *(short *)((long)info + 0x5e)) &
                   0x7ff;
          *(short *)((long)info + 0x5e) = (short)uVar17;
          *(int *)((long)info + 0x30) =
               (int)(long)((1.0 / (float)(int)(0x800 - uVar17)) * *(float *)((long)info + 0x180));
        }
        *(short *)((long)info + 0x5c) = sVar1 + -1;
      }
    }
    *(ulong *)((long)info + 0x50) = uVar16 & 0xffffffff;
    iVar21 = 0;
    iVar9 = 0;
    for (lVar18 = 0; lVar18 != 4; lVar18 = lVar18 + 1) {
      if (*(char *)((long)info + lVar18 * 0x10 + 0x15) == '\0') {
        bVar12 = *(byte *)((long)info + 0xfc);
        if ((bVar12 & 0x20) == 0 || lVar18 != 1) {
          if ((bVar12 >> ((uint)lVar18 & 0x1f) & 1) == 0) goto LAB_001606a4;
          puVar19 = (ushort *)((long)info + lVar18 * 0x10 + 8);
          uVar17 = *(int *)(puVar19 + 2) + *(int *)(puVar19 + 4);
          uVar14 = uVar17 >> 0x10;
          if ((char)bVar12 < '\0' && lVar18 == 3) {
            *(uint *)(puVar19 + 2) = uVar17 & 0xffff;
            while (cVar13 = (char)uVar14, uVar14 = (uint)(byte)(cVar13 - 1), cVar13 != '\0') {
              UVar4 = ws_audio_update::noise_bit[*(byte *)((long)info + 0x60)];
              uVar17 = *(uint *)((long)info + 100) & UVar4 - 1;
              if (uVar17 == 0) {
                uVar17 = UVar4 - 1;
              }
              uVar7 = 0;
              for (uVar10 = ws_audio_update::noise_mask[*(byte *)((long)info + 0x60)] & uVar17;
                  uVar10 != 0; uVar10 = uVar10 >> 1) {
                uVar7 = uVar7 ^ uVar10 & 1;
              }
              if (uVar7 == 0) {
                UVar4 = 0;
              }
              *(uint *)((long)info + 100) = (uVar17 | UVar4) >> 1;
            }
            uVar17 = *(uint *)((long)info + 100);
            *(char *)((long)info + 0xfe) = (char)uVar17;
            *(byte *)((long)info + 0xff) = (byte)(uVar17 >> 8) & 0x7f;
            uVar14 = (uint)(byte)puVar19[1];
            iVar15 = 0x7f;
            if ((uVar17 & 1) == 0) {
              iVar15 = -0x80;
            }
          }
          else {
            *(uint *)(puVar19 + 2) = uVar17 & 0xffff;
            bVar11 = (char)(uVar17 >> 0x10) + (char)puVar19[6];
            bVar12 = bVar11 & 0x1f;
            *(byte *)(puVar19 + 6) = bVar12;
            bVar12 = *(byte *)(*(long *)((long)info + 0x170) +
                              ((ulong)(bVar12 >> 1) | (ulong)(*puVar19 & 0xfffffff0)));
            uVar6 = (bVar12 & 0xf) << 4;
            if ((bVar11 & 1) != 0) {
              uVar6 = bVar12 & 0xfff0;
            }
            uVar14 = (uint)(byte)puVar19[1];
            iVar15 = (int)(short)(uVar6 - 0x80);
          }
          iVar5 = uVar14 * iVar15;
          pbVar20 = (byte *)((long)puVar19 + 3);
        }
        else {
          iVar15 = *(byte *)((long)info + 0xf5) - 0x80;
          iVar5 = (uint)*(byte *)((long)info + 0x6a) * iVar15;
          pbVar20 = (byte *)((long)info + 0x6b);
        }
        iVar21 = iVar21 + iVar5;
        iVar9 = iVar9 + (uint)*pbVar20 * iVar15;
      }
LAB_001606a4:
    }
    uVar6 = *(ushort *)((long)info + 0x68);
    pDVar2[uVar8] = iVar21 * (uint)uVar6;
    pDVar3[uVar8] = iVar9 * (uint)uVar6;
    uVar8 = uVar8 + 1;
  } while( true );
}

Assistant:

static void ws_audio_update(void* info, UINT32 length, DEV_SMPL** buffer)
{
	wsa_state* chip = (wsa_state*)info;
	DEV_SMPL* bufL;
	DEV_SMPL* bufR;
	UINT32 i;
	UINT8 ch, cnt;
	INT16 w;	// could fit into INT8
	DEV_SMPL l, r;

	bufL = buffer[0];
	bufR = buffer[1];
	for (i=0; i<length; i++)
	{
		UINT32 swpCount;
		
		RC_STEP(&chip->HBlankTmr);
		for (swpCount = RC_GET_VAL(&chip->HBlankTmr); swpCount > 0; swpCount --)
			ws_audio_process(chip);
		RC_MASK(&chip->HBlankTmr);

		l = r = 0;

		for (ch=0; ch<4; ch++)
		{
			if (chip->ws_audio[ch].Muted)
				continue;
			
			if ((ch==1) && (SNDMOD&0x20))
			{
				// Voice出力
				w = chip->ws_ioRam[0x89];
				w -= 0x80;
				l += chip->PCMVolumeLeft  * w;
				r += chip->PCMVolumeRight * w;
			}
			else if (SNDMOD&(1<<ch))
			{
				if ((ch==3) && (SNDMOD&0x80))
				{
					//Noise

					//OSWANの擬似乱数の処理と同等のつもり
#define BIT(n) (1<<n)
					static const UINT32 noise_mask[8] =
					{
						BIT(0)|BIT(1),
						BIT(0)|BIT(1)|BIT(4)|BIT(5),
						BIT(0)|BIT(1)|BIT(3)|BIT(4),
						BIT(0)|BIT(1)|BIT(4)|BIT(6),
						BIT(0)|BIT(2),
						BIT(0)|BIT(3),
						BIT(0)|BIT(4),
						BIT(0)|BIT(2)|BIT(3)|BIT(4)
					};

					static const UINT32 noise_bit[8] =
					{
						BIT(15),
						BIT(14),
						BIT(13),
						BIT(12),
						BIT(11),
						BIT(10),
						BIT(9),
						BIT(8)
					};

					UINT32 Masked, XorReg;

					chip->ws_audio[ch].offset += chip->ws_audio[ch].delta;
					cnt = chip->ws_audio[ch].offset>>16;
					chip->ws_audio[ch].offset &= 0xffff;
					while (cnt > 0)
					{
						cnt--;

						chip->NoiseRng &= noise_bit[chip->NoiseType]-1;
						if (!chip->NoiseRng) chip->NoiseRng = noise_bit[chip->NoiseType]-1;

						Masked = chip->NoiseRng & noise_mask[chip->NoiseType];
						XorReg = 0;
						while (Masked)
						{
							XorReg ^= Masked&1;
							Masked >>= 1;
						}
						if (XorReg)
							chip->NoiseRng |= noise_bit[chip->NoiseType];
						chip->NoiseRng >>= 1;
					}

					PCSRL = (byte)(chip->NoiseRng&0xff);
					PCSRH = (byte)((chip->NoiseRng>>8)&0x7f);

					w = (chip->NoiseRng&1)? 0x7f:-0x80;
					l += chip->ws_audio[ch].lvol * w;
					r += chip->ws_audio[ch].rvol * w;
				}
				else
				{
					chip->ws_audio[ch].offset += chip->ws_audio[ch].delta;
					cnt = chip->ws_audio[ch].offset>>16;
					chip->ws_audio[ch].offset &= 0xffff;
					chip->ws_audio[ch].pos += cnt;
					chip->ws_audio[ch].pos &= 0x1f;
					w = chip->ws_internalRam[(chip->ws_audio[ch].wave&0xFFF0) + (chip->ws_audio[ch].pos>>1)];
					if ((chip->ws_audio[ch].pos&1) == 0)
						w = (w<<4)&0xf0;	//下位ニブル
					else
						w = w&0xf0;			//上位ニブル
					w -= 0x80;
					l += chip->ws_audio[ch].lvol * w;
					r += chip->ws_audio[ch].rvol * w;
				}
			}
		}

		bufL[i] = l * chip->MainVolume;
		bufR[i] = r * chip->MainVolume;
	}
}